

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> WeakHashLen32WithSeeds(char *s,uint64 a,uint64 b)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  lVar3 = a + *(long *)s;
  uVar1 = *(long *)(s + 8) + lVar3 + *(long *)(s + 0x10);
  uVar2 = b + lVar3 + *(long *)(s + 0x18);
  pVar4.first = uVar1 + *(long *)(s + 0x18);
  pVar4.second = (uVar1 >> 0x2c | uVar1 * 0x100000) + lVar3 + (uVar2 >> 0x15 | uVar2 << 0x2b);
  return pVar4;
}

Assistant:

static pair<uint64, uint64> WeakHashLen32WithSeeds(
    uint64 w, uint64 x, uint64 y, uint64 z, uint64 a, uint64 b) {
  a += w;
  b = Rotate(b + a + z, 21);
  uint64 c = a;
  a += x;
  a += y;
  b += Rotate(a, 44);
  return make_pair(a + z, b + c);
}